

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_expect_str_match(mpack_reader_t *reader,char *str,size_t len)

{
  byte bVar1;
  size_t sVar2;
  
  if (len >> 0x20 != 0) {
    mpack_reader_flag_error(reader,mpack_error_type);
  }
  mpack_expect_str_length(reader,(uint32_t)len);
  if (reader->error == mpack_ok) {
    for (sVar2 = 0; len != sVar2; sVar2 = sVar2 + 1) {
      bVar1 = mpack_expect_native_u8(reader);
      if ((uint)bVar1 != (int)str[sVar2]) {
        mpack_reader_flag_error(reader,mpack_error_type);
        return;
      }
    }
  }
  return;
}

Assistant:

void mpack_expect_str_match(mpack_reader_t* reader, const char* str, size_t len) {
    mpack_assert(str != NULL, "str cannot be NULL");

    // expect a str the correct length
    if (len > UINT32_MAX)
        mpack_reader_flag_error(reader, mpack_error_type);
    mpack_expect_str_length(reader, (uint32_t)len);
    if (mpack_reader_error(reader))
        return;
    mpack_reader_track_bytes(reader, len);

    // check each byte one by one (matched strings are likely to be very small)
    for (; len > 0; --len) {
        if (mpack_expect_native_u8(reader) != *str++) {
            mpack_reader_flag_error(reader, mpack_error_type);
            return;
        }
    }

    mpack_done_str(reader);
}